

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_gstream.c
# Opt level: O0

HTS_Boolean
HTS_GStreamSet_create
          (HTS_GStreamSet *gss,HTS_PStreamSet *pss,size_t stage,HTS_Boolean use_log_gain,
          size_t sampling_rate,size_t fperiod,double alpha,double beta,HTS_Boolean *stop,
          double volume,HTS_Audio *audio)

{
  HTS_Boolean HVar1;
  size_t sVar2;
  void *pvVar3;
  undefined8 in_RDX;
  HTS_PStreamSet *in_RSI;
  long *in_RDI;
  long in_R9;
  bool bVar4;
  double dVar5;
  char *in_stack_00000008;
  HTS_Audio *in_stack_00000010;
  double *lpf;
  size_t nlpf;
  HTS_Vocoder v;
  size_t msd_frame;
  size_t k;
  size_t j;
  size_t i;
  size_t in_stack_fffffffffffffe68;
  HTS_GStreamSet *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  HTS_Boolean in_stack_fffffffffffffe7f;
  size_t stage_00;
  double *rawdata;
  HTS_Vocoder *in_stack_fffffffffffffe90;
  double in_stack_fffffffffffffe98;
  double in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffeb8;
  double in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  HTS_Vocoder *in_stack_fffffffffffffed0;
  HTS_Audio *in_stack_fffffffffffffee0;
  size_t local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  HTS_Boolean local_1;
  
  rawdata = (double *)0x0;
  stage_00 = 0;
  if ((in_RDI[3] == 0) && (in_RDI[4] == 0)) {
    sVar2 = HTS_PStreamSet_get_nstream(in_RSI);
    in_RDI[2] = sVar2;
    sVar2 = HTS_PStreamSet_get_total_frame(in_RSI);
    in_RDI[1] = sVar2;
    *in_RDI = in_R9 * in_RDI[1];
    pvVar3 = HTS_calloc(CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                        (size_t)in_stack_fffffffffffffe70);
    in_RDI[3] = (long)pvVar3;
    for (local_58 = 0; local_58 < (ulong)in_RDI[2]; local_58 = local_58 + 1) {
      sVar2 = HTS_PStreamSet_get_vector_length(in_RSI,local_58);
      *(size_t *)(in_RDI[3] + local_58 * 0x10) = sVar2;
      pvVar3 = HTS_calloc(CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                          (size_t)in_stack_fffffffffffffe70);
      *(void **)(in_RDI[3] + local_58 * 0x10 + 8) = pvVar3;
      for (local_60 = 0; local_60 < (ulong)in_RDI[1]; local_60 = local_60 + 1) {
        pvVar3 = HTS_calloc(CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                            (size_t)in_stack_fffffffffffffe70);
        *(void **)(*(long *)(in_RDI[3] + local_58 * 0x10 + 8) + local_60 * 8) = pvVar3;
      }
    }
    pvVar3 = HTS_calloc(CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                        (size_t)in_stack_fffffffffffffe70);
    in_RDI[4] = (long)pvVar3;
    for (local_58 = 0; local_58 < (ulong)in_RDI[2]; local_58 = local_58 + 1) {
      HVar1 = HTS_PStreamSet_is_msd(in_RSI,local_58);
      if (HVar1 == '\0') {
        for (local_60 = 0; local_60 < (ulong)in_RDI[1]; local_60 = local_60 + 1) {
          for (local_68 = 0; local_68 < *(ulong *)(in_RDI[3] + local_58 * 0x10);
              local_68 = local_68 + 1) {
            dVar5 = HTS_PStreamSet_get_parameter(in_RSI,local_58,local_60,local_68);
            *(double *)
             (*(long *)(*(long *)(in_RDI[3] + local_58 * 0x10 + 8) + local_60 * 8) + local_68 * 8) =
                 dVar5;
          }
        }
      }
      else {
        local_70 = 0;
        for (local_60 = 0; local_60 < (ulong)in_RDI[1]; local_60 = local_60 + 1) {
          HVar1 = HTS_PStreamSet_get_msd_flag(in_RSI,local_58,local_60);
          if (HVar1 == '\x01') {
            for (local_68 = 0; local_68 < *(ulong *)(in_RDI[3] + local_58 * 0x10);
                local_68 = local_68 + 1) {
              dVar5 = HTS_PStreamSet_get_parameter(in_RSI,local_58,local_70,local_68);
              *(double *)
               (*(long *)(*(long *)(in_RDI[3] + local_58 * 0x10 + 8) + local_60 * 8) + local_68 * 8)
                   = dVar5;
            }
            local_70 = local_70 + 1;
          }
          else {
            for (local_68 = 0; local_68 < *(ulong *)(in_RDI[3] + local_58 * 0x10);
                local_68 = local_68 + 1) {
              *(undefined8 *)
               (*(long *)(*(long *)(in_RDI[3] + local_58 * 0x10 + 8) + local_60 * 8) + local_68 * 8)
                   = 0xc202a05f20000000;
            }
          }
        }
      }
    }
    if ((in_RDI[2] == 2) || (in_RDI[2] == 3)) {
      sVar2 = HTS_PStreamSet_get_vector_length(in_RSI,1);
      if (sVar2 == 1) {
        if (((ulong)in_RDI[2] < 3) || ((*(ulong *)(in_RDI[3] + 0x20) & 1) != 0)) {
          HTS_Vocoder_initialize
                    (in_stack_fffffffffffffe90,(size_t)rawdata,stage_00,in_stack_fffffffffffffe7f,
                     (size_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          if (2 < (ulong)in_RDI[2]) {
            rawdata = *(double **)(in_RDI[3] + 0x20);
          }
          local_58 = 0;
          while( true ) {
            bVar4 = false;
            if (local_58 < (ulong)in_RDI[1]) {
              bVar4 = *in_stack_00000008 == '\0';
            }
            if (!bVar4) break;
            HTS_Vocoder_synthesize
                      (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                       in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                       ,(double)in_stack_fffffffffffffe90,rawdata,in_stack_fffffffffffffee0);
            local_58 = local_58 + 1;
          }
          HTS_Vocoder_clear((HTS_Vocoder *)0x11192d);
          if (in_stack_00000010 != (HTS_Audio *)0x0) {
            HTS_Audio_flush(in_stack_00000010);
          }
          local_1 = '\x01';
        }
        else {
          HTS_error(1,
                    "HTS_GStreamSet_create: The number of low-pass filter coefficient should be odd numbers."
                   );
          HTS_GStreamSet_clear(in_stack_fffffffffffffe70);
          local_1 = '\0';
        }
      }
      else {
        HTS_error(1,"HTS_GStreamSet_create: The size of lf0 static vector should be 1.\n");
        HTS_GStreamSet_clear(in_stack_fffffffffffffe70);
        local_1 = '\0';
      }
    }
    else {
      HTS_error(1,"HTS_GStreamSet_create: The number of streams should be 2 or 3.\n");
      HTS_GStreamSet_clear(in_stack_fffffffffffffe70);
      local_1 = '\0';
    }
  }
  else {
    HTS_error(1,"HTS_GStreamSet_create: HTS_GStreamSet is not initialized.\n",in_RDX,
              in_stack_00000008);
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

HTS_Boolean HTS_GStreamSet_create(HTS_GStreamSet * gss, HTS_PStreamSet * pss, size_t stage, HTS_Boolean use_log_gain, size_t sampling_rate, size_t fperiod, double alpha, double beta, HTS_Boolean * stop, double volume, HTS_Audio * audio)
{
   size_t i, j, k;
   size_t msd_frame;
   HTS_Vocoder v;
   size_t nlpf = 0;
   double *lpf = NULL;

   /* check */
   if (gss->gstream || gss->gspeech) {
      HTS_error(1, "HTS_GStreamSet_create: HTS_GStreamSet is not initialized.\n");
      return FALSE;
   }

   /* initialize */
   gss->nstream = HTS_PStreamSet_get_nstream(pss);
   gss->total_frame = HTS_PStreamSet_get_total_frame(pss);
   gss->total_nsample = fperiod * gss->total_frame;
   gss->gstream = (HTS_GStream *) HTS_calloc(gss->nstream, sizeof(HTS_GStream));
   for (i = 0; i < gss->nstream; i++) {
      gss->gstream[i].vector_length = HTS_PStreamSet_get_vector_length(pss, i);
      gss->gstream[i].par = (double **) HTS_calloc(gss->total_frame, sizeof(double *));
      for (j = 0; j < gss->total_frame; j++)
         gss->gstream[i].par[j] = (double *) HTS_calloc(gss->gstream[i].vector_length, sizeof(double));
   }
   gss->gspeech = (double *) HTS_calloc(gss->total_nsample, sizeof(double));

   /* copy generated parameter */
   for (i = 0; i < gss->nstream; i++) {
      if (HTS_PStreamSet_is_msd(pss, i)) {      /* for MSD */
         for (j = 0, msd_frame = 0; j < gss->total_frame; j++)
            if (HTS_PStreamSet_get_msd_flag(pss, i, j) == TRUE) {
               for (k = 0; k < gss->gstream[i].vector_length; k++)
                  gss->gstream[i].par[j][k] = HTS_PStreamSet_get_parameter(pss, i, msd_frame, k);
               msd_frame++;
            } else
               for (k = 0; k < gss->gstream[i].vector_length; k++)
                  gss->gstream[i].par[j][k] = HTS_NODATA;
      } else {                  /* for non MSD */
         for (j = 0; j < gss->total_frame; j++)
            for (k = 0; k < gss->gstream[i].vector_length; k++)
               gss->gstream[i].par[j][k] = HTS_PStreamSet_get_parameter(pss, i, j, k);
      }
   }

   /* check */
   if (gss->nstream != 2 && gss->nstream != 3) {
      HTS_error(1, "HTS_GStreamSet_create: The number of streams should be 2 or 3.\n");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }
   if (HTS_PStreamSet_get_vector_length(pss, 1) != 1) {
      HTS_error(1, "HTS_GStreamSet_create: The size of lf0 static vector should be 1.\n");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }
   if (gss->nstream >= 3 && gss->gstream[2].vector_length % 2 == 0) {
      HTS_error(1, "HTS_GStreamSet_create: The number of low-pass filter coefficient should be odd numbers.");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }

   /* synthesize speech waveform */
   HTS_Vocoder_initialize(&v, gss->gstream[0].vector_length - 1, stage, use_log_gain, sampling_rate, fperiod);
   if (gss->nstream >= 3)
      nlpf = gss->gstream[2].vector_length;
   for (i = 0; i < gss->total_frame && (*stop) == FALSE; i++) {
      j = i * fperiod;
      if (gss->nstream >= 3)
         lpf = &gss->gstream[2].par[i][0];
      HTS_Vocoder_synthesize(&v, gss->gstream[0].vector_length - 1, gss->gstream[1].par[i][0], &gss->gstream[0].par[i][0], nlpf, lpf, alpha, beta, volume, &gss->gspeech[j], audio);
   }
   HTS_Vocoder_clear(&v);
   if (audio)
      HTS_Audio_flush(audio);

   return TRUE;
}